

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,
          back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *it)

{
  ulong uVar1;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> bVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  wchar_t *__last;
  wchar_t *pwVar6;
  wchar_t wVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  char_type buffer [26];
  wchar_t local_98 [26];
  
  bVar2 = (back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>)it->container;
  uVar4 = *(ulong *)this;
  __last = local_98 + *(int *)(this + 8);
  pwVar6 = __last;
  if (uVar4 < 100) {
    bVar13 = false;
  }
  else {
    iVar9 = -1;
    uVar11 = 1;
    iVar5 = -2;
    uVar12 = 2;
    uVar8 = uVar4;
    do {
      uVar4 = uVar8 / 100;
      uVar1 = (ulong)(uint)(((int)uVar8 + (int)uVar4 * -100) * 2);
      pwVar6[-1] = (int)(char)internal::basic_data<void>::DIGITS[uVar1 + 1];
      lVar3 = -4;
      if ((int)(uVar11 / 3) * 3 + iVar9 == 0) {
        pwVar6[-2] = *(wchar_t *)(this + 0xc);
        lVar3 = -8;
      }
      *(int *)((long)pwVar6 + lVar3 + -4) = (int)(char)internal::basic_data<void>::DIGITS[uVar1];
      if ((int)(uVar12 / 3) * 3 + iVar5 == 0) {
        *(undefined4 *)((long)pwVar6 + lVar3 + -8) = *(undefined4 *)(this + 0xc);
        lVar3 = lVar3 + -8;
      }
      else {
        lVar3 = lVar3 + -4;
      }
      pwVar6 = (wchar_t *)((long)pwVar6 + lVar3);
      iVar9 = iVar9 + -2;
      uVar10 = (int)uVar11 + 2;
      uVar11 = (ulong)uVar10;
      iVar5 = iVar5 + -2;
      uVar12 = (ulong)((int)uVar12 + 2);
      bVar13 = 9999 < uVar8;
      uVar8 = uVar4;
    } while (bVar13);
    bVar13 = iVar9 + (uVar10 / 3) * 3 == 0;
  }
  if (uVar4 < 10) {
    wVar7 = (uint)uVar4 | 0x30;
  }
  else {
    uVar4 = (uVar4 & 0xffffffff) * 2;
    pwVar6[-1] = (int)(char)internal::basic_data<void>::DIGITS[(uVar4 & 0xffffffff) + 1];
    lVar3 = -4;
    if (bVar13) {
      pwVar6[-2] = *(wchar_t *)(this + 0xc);
      lVar3 = -8;
    }
    pwVar6 = (wchar_t *)((long)pwVar6 + lVar3);
    wVar7 = (wchar_t)(char)internal::basic_data<void>::DIGITS[uVar4];
  }
  pwVar6[-1] = wVar7;
  bVar2 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<wchar_t*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                    (local_98,__last,bVar2);
  it->container = (vector<wchar_t,_std::allocator<wchar_t>_> *)bVar2;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }